

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_bool32 ma_dr_flac_oggbs__goto_next_page
                    (ma_dr_flac_oggbs *oggbs,ma_dr_flac_ogg_crc_mismatch_recovery recoveryMethod)

{
  ma_result mVar1;
  ma_bool32 mVar2;
  size_t sVar3;
  ulong uVar4;
  ma_uint32 mVar5;
  uint uVar6;
  ma_uint32 mVar7;
  size_t sVar8;
  ma_uint32 bytesRead;
  ma_dr_flac_ogg_page_header header;
  ma_uint32 local_158;
  uint local_154;
  ma_dr_flac_ogg_page_header local_150;
  
  local_158 = 0;
  mVar1 = ma_dr_flac_ogg__read_page_header
                    (oggbs->onRead,oggbs->pUserData,&local_150,&local_154,&local_158);
  if (mVar1 == MA_SUCCESS) {
    do {
      oggbs->currentBytePos = oggbs->currentBytePos + (ulong)local_154;
      if ((ulong)local_150.segmentCount == 0) {
        sVar8 = 0;
        if (local_150.serialNumber == oggbs->serialNumber) {
LAB_00167605:
          mVar7 = (ma_uint32)sVar8;
          sVar3 = (*oggbs->onRead)(oggbs->pUserData,oggbs->pageData,sVar8);
          oggbs->currentBytePos = oggbs->currentBytePos + sVar3;
          if (sVar3 != sVar8) {
            return 0;
          }
          oggbs->pageDataSize = mVar7;
          mVar5 = local_158;
          if (mVar7 != 0) {
            sVar3 = 0;
            do {
              mVar5 = mVar5 << 8 ^
                      ma_dr_flac__crc32_table[mVar5 >> 0x18 ^ (uint)oggbs->pageData[sVar3]];
              sVar3 = sVar3 + 1;
            } while (sVar8 != sVar3);
          }
          if (mVar5 == local_150.checksum) {
            memcpy(&oggbs->currentPageHeader,&local_150,0x120);
            oggbs->bytesRemainingInPage = mVar7;
            return 1;
          }
          if (recoveryMethod != ma_dr_flac_ogg_recover_on_crc_mismatch) {
            ma_dr_flac_oggbs__goto_next_page(oggbs,ma_dr_flac_ogg_recover_on_crc_mismatch);
            return 0;
          }
        }
      }
      else {
        uVar4 = 0;
        sVar8 = 0;
        do {
          uVar6 = (int)sVar8 + (uint)local_150.segmentTable[uVar4];
          sVar8 = (size_t)uVar6;
          uVar4 = uVar4 + 1;
        } while (local_150.segmentCount != uVar4);
        if (uVar6 < 0xff1c) {
          if (local_150.serialNumber == oggbs->serialNumber) goto LAB_00167605;
          if ((uVar6 != 0) &&
             (mVar2 = ma_dr_flac_oggbs__seek_physical
                                (oggbs,(ulong)uVar6,ma_dr_flac_seek_origin_current), mVar2 == 0)) {
            return 0;
          }
        }
      }
      local_158 = 0;
      mVar1 = ma_dr_flac_ogg__read_page_header
                        (oggbs->onRead,oggbs->pUserData,&local_150,&local_154,&local_158);
    } while (mVar1 == MA_SUCCESS);
  }
  return 0;
}

Assistant:

static ma_bool32 ma_dr_flac_oggbs__goto_next_page(ma_dr_flac_oggbs* oggbs, ma_dr_flac_ogg_crc_mismatch_recovery recoveryMethod)
{
    ma_dr_flac_ogg_page_header header;
    for (;;) {
        ma_uint32 crc32 = 0;
        ma_uint32 bytesRead;
        ma_uint32 pageBodySize;
#ifndef MA_DR_FLAC_NO_CRC
        ma_uint32 actualCRC32;
#endif
        if (ma_dr_flac_ogg__read_page_header(oggbs->onRead, oggbs->pUserData, &header, &bytesRead, &crc32) != MA_SUCCESS) {
            return MA_FALSE;
        }
        oggbs->currentBytePos += bytesRead;
        pageBodySize = ma_dr_flac_ogg__get_page_body_size(&header);
        if (pageBodySize > MA_DR_FLAC_OGG_MAX_PAGE_SIZE) {
            continue;
        }
        if (header.serialNumber != oggbs->serialNumber) {
            if (pageBodySize > 0 && !ma_dr_flac_oggbs__seek_physical(oggbs, pageBodySize, ma_dr_flac_seek_origin_current)) {
                return MA_FALSE;
            }
            continue;
        }
        if (ma_dr_flac_oggbs__read_physical(oggbs, oggbs->pageData, pageBodySize) != pageBodySize) {
            return MA_FALSE;
        }
        oggbs->pageDataSize = pageBodySize;
#ifndef MA_DR_FLAC_NO_CRC
        actualCRC32 = ma_dr_flac_crc32_buffer(crc32, oggbs->pageData, oggbs->pageDataSize);
        if (actualCRC32 != header.checksum) {
            if (recoveryMethod == ma_dr_flac_ogg_recover_on_crc_mismatch) {
                continue;
            } else {
                ma_dr_flac_oggbs__goto_next_page(oggbs, ma_dr_flac_ogg_recover_on_crc_mismatch);
                return MA_FALSE;
            }
        }
#else
        (void)recoveryMethod;
#endif
        oggbs->currentPageHeader = header;
        oggbs->bytesRemainingInPage = pageBodySize;
        return MA_TRUE;
    }
}